

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PairedReadsMapper.cc
# Opt level: O3

sgNodeID_t __thiscall
PairedReadsMapper::get_node_inmediate_neighbours(PairedReadsMapper *this,sgNodeID_t node)

{
  int iVar1;
  key_type *pkVar2;
  pair<long,_int> *ppVar3;
  pointer pvVar4;
  int *piVar5;
  mapped_type *pmVar6;
  ulong uVar7;
  pair<long,_int> *cand;
  int *piVar8;
  pair<long,_int> *ppVar9;
  int *piVar10;
  int iVar11;
  long *node_1;
  key_type *__k;
  long lVar12;
  vector<long,_std::allocator<long>_> *path;
  pointer pvVar13;
  __node_base _Var14;
  long lVar15;
  pair<long,_int> *ppVar16;
  vector<std::pair<long,_int>,_std::allocator<std::pair<long,_int>_>_> count_vector;
  unordered_map<long,_int,_std::hash<long>,_std::equal_to<long>,_std::allocator<std::pair<const_long,_int>_>_>
  counter;
  vector<std::vector<long,_std::allocator<long>_>,_std::allocator<std::vector<long,_std::allocator<long>_>_>_>
  local_88;
  pair<long,_int> local_70;
  _Hashtable<long,_std::pair<const_long,_int>,_std::allocator<std::pair<const_long,_int>_>,_std::__detail::_Select1st,_std::equal_to<long>,_std::hash<long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
  local_60;
  
  local_60._M_buckets = &local_60._M_single_bucket;
  local_60._M_bucket_count = 1;
  local_60._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  local_60._M_element_count = 0;
  local_60._M_rehash_policy._M_max_load_factor = 1.0;
  local_60._M_rehash_policy._M_next_resize = 0;
  local_60._M_single_bucket = (__node_base_ptr)0x0;
  all_paths_fw(&local_88,this,node,true,true);
  if (local_88.
      super__Vector_base<std::vector<long,_std::allocator<long>_>,_std::allocator<std::vector<long,_std::allocator<long>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start !=
      local_88.
      super__Vector_base<std::vector<long,_std::allocator<long>_>,_std::allocator<std::vector<long,_std::allocator<long>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish) {
    pvVar13 = local_88.
              super__Vector_base<std::vector<long,_std::allocator<long>_>,_std::allocator<std::vector<long,_std::allocator<long>_>_>_>
              ._M_impl.super__Vector_impl_data._M_start;
    do {
      pkVar2 = (pvVar13->super__Vector_base<long,_std::allocator<long>_>)._M_impl.
               super__Vector_impl_data._M_finish;
      for (__k = (pvVar13->super__Vector_base<long,_std::allocator<long>_>)._M_impl.
                 super__Vector_impl_data._M_start; __k != pkVar2; __k = __k + 1) {
        pmVar6 = std::__detail::
                 _Map_base<long,_std::pair<const_long,_int>,_std::allocator<std::pair<const_long,_int>_>,_std::__detail::_Select1st,_std::equal_to<long>,_std::hash<long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                 ::operator[]((_Map_base<long,_std::pair<const_long,_int>,_std::allocator<std::pair<const_long,_int>_>,_std::__detail::_Select1st,_std::equal_to<long>,_std::hash<long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                               *)&local_60,__k);
        *pmVar6 = *pmVar6 + 1;
      }
      pvVar13 = pvVar13 + 1;
    } while (pvVar13 !=
             local_88.
             super__Vector_base<std::vector<long,_std::allocator<long>_>,_std::allocator<std::vector<long,_std::allocator<long>_>_>_>
             ._M_impl.super__Vector_impl_data._M_finish);
  }
  std::
  vector<std::vector<long,_std::allocator<long>_>,_std::allocator<std::vector<long,_std::allocator<long>_>_>_>
  ::~vector(&local_88);
  local_88.
  super__Vector_base<std::vector<long,_std::allocator<long>_>,_std::allocator<std::vector<long,_std::allocator<long>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_88.
  super__Vector_base<std::vector<long,_std::allocator<long>_>,_std::allocator<std::vector<long,_std::allocator<long>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_88.
  super__Vector_base<std::vector<long,_std::allocator<long>_>,_std::allocator<std::vector<long,_std::allocator<long>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  ppVar3 = (pair<long,_int> *)
           local_88.
           super__Vector_base<std::vector<long,_std::allocator<long>_>,_std::allocator<std::vector<long,_std::allocator<long>_>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  if (local_60._M_before_begin._M_nxt != (_Hash_node_base *)0x0) {
    _Var14._M_nxt = local_60._M_before_begin._M_nxt;
    do {
      local_70.first = (long)_Var14._M_nxt[1]._M_nxt;
      local_70.second = *(int *)&_Var14._M_nxt[2]._M_nxt;
      if (local_88.
          super__Vector_base<std::vector<long,_std::allocator<long>_>,_std::allocator<std::vector<long,_std::allocator<long>_>_>_>
          ._M_impl.super__Vector_impl_data._M_finish ==
          local_88.
          super__Vector_base<std::vector<long,_std::allocator<long>_>,_std::allocator<std::vector<long,_std::allocator<long>_>_>_>
          ._M_impl.super__Vector_impl_data._M_end_of_storage) {
        std::vector<std::pair<long,int>,std::allocator<std::pair<long,int>>>::
        _M_realloc_insert<std::pair<long,int>>
                  ((vector<std::pair<long,int>,std::allocator<std::pair<long,int>>> *)&local_88,
                   (iterator)
                   local_88.
                   super__Vector_base<std::vector<long,_std::allocator<long>_>,_std::allocator<std::vector<long,_std::allocator<long>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_finish,&local_70);
      }
      else {
        local_70.first._4_4_ = (undefined4)((ulong)local_70.first >> 0x20);
        *(undefined4 *)
         &(local_88.
           super__Vector_base<std::vector<long,_std::allocator<long>_>,_std::allocator<std::vector<long,_std::allocator<long>_>_>_>
           ._M_impl.super__Vector_impl_data._M_finish)->
          super__Vector_base<long,_std::allocator<long>_> = (undefined4)local_70.first;
        *(undefined4 *)
         ((long)&(local_88.
                  super__Vector_base<std::vector<long,_std::allocator<long>_>,_std::allocator<std::vector<long,_std::allocator<long>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_finish)->
                 super__Vector_base<long,_std::allocator<long>_> + 4) = local_70.first._4_4_;
        *(int *)((long)local_88.
                       super__Vector_base<std::vector<long,_std::allocator<long>_>,_std::allocator<std::vector<long,_std::allocator<long>_>_>_>
                       ._M_impl.super__Vector_impl_data._M_finish + 8) = local_70.second;
        *(undefined4 *)
         ((long)local_88.
                super__Vector_base<std::vector<long,_std::allocator<long>_>,_std::allocator<std::vector<long,_std::allocator<long>_>_>_>
                ._M_impl.super__Vector_impl_data._M_finish + 0xc) = local_70._12_4_;
        local_88.
        super__Vector_base<std::vector<long,_std::allocator<long>_>,_std::allocator<std::vector<long,_std::allocator<long>_>_>_>
        ._M_impl.super__Vector_impl_data._M_finish =
             (pointer)((long)local_88.
                             super__Vector_base<std::vector<long,_std::allocator<long>_>,_std::allocator<std::vector<long,_std::allocator<long>_>_>_>
                             ._M_impl.super__Vector_impl_data._M_finish + 0x10);
      }
      pvVar4 = local_88.
               super__Vector_base<std::vector<long,_std::allocator<long>_>,_std::allocator<std::vector<long,_std::allocator<long>_>_>_>
               ._M_impl.super__Vector_impl_data._M_finish;
      pvVar13 = local_88.
                super__Vector_base<std::vector<long,_std::allocator<long>_>,_std::allocator<std::vector<long,_std::allocator<long>_>_>_>
                ._M_impl.super__Vector_impl_data._M_start;
      _Var14._M_nxt = (_Var14._M_nxt)->_M_nxt;
    } while (_Var14._M_nxt != (_Hash_node_base *)0x0);
    ppVar3 = (pair<long,_int> *)
             local_88.
             super__Vector_base<std::vector<long,_std::allocator<long>_>,_std::allocator<std::vector<long,_std::allocator<long>_>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
    if (local_88.
        super__Vector_base<std::vector<long,_std::allocator<long>_>,_std::allocator<std::vector<long,_std::allocator<long>_>_>_>
        ._M_impl.super__Vector_impl_data._M_start !=
        local_88.
        super__Vector_base<std::vector<long,_std::allocator<long>_>,_std::allocator<std::vector<long,_std::allocator<long>_>_>_>
        ._M_impl.super__Vector_impl_data._M_finish) {
      lVar15 = (long)local_88.
                     super__Vector_base<std::vector<long,_std::allocator<long>_>,_std::allocator<std::vector<long,_std::allocator<long>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_finish -
               (long)local_88.
                     super__Vector_base<std::vector<long,_std::allocator<long>_>,_std::allocator<std::vector<long,_std::allocator<long>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_start;
      uVar7 = lVar15 >> 4;
      lVar12 = 0x3f;
      if (uVar7 != 0) {
        for (; uVar7 >> lVar12 == 0; lVar12 = lVar12 + -1) {
        }
      }
      std::
      __introsort_loop<__gnu_cxx::__normal_iterator<std::pair<long,int>*,std::vector<std::pair<long,int>,std::allocator<std::pair<long,int>>>>,long,__gnu_cxx::__ops::_Iter_comp_iter<PairedReadsMapper::get_node_inmediate_neighbours(long)::__0>>
                (local_88.
                 super__Vector_base<std::vector<long,_std::allocator<long>_>,_std::allocator<std::vector<long,_std::allocator<long>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_start,
                 local_88.
                 super__Vector_base<std::vector<long,_std::allocator<long>_>,_std::allocator<std::vector<long,_std::allocator<long>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_finish,((uint)lVar12 ^ 0x3f) * 2 ^ 0x7e);
      if (lVar15 < 0x101) {
        std::
        __insertion_sort<__gnu_cxx::__normal_iterator<std::pair<long,int>*,std::vector<std::pair<long,int>,std::allocator<std::pair<long,int>>>>,__gnu_cxx::__ops::_Iter_comp_iter<PairedReadsMapper::get_node_inmediate_neighbours(long)::__0>>
                  (pvVar13,pvVar4);
        ppVar3 = (pair<long,_int> *)
                 local_88.
                 super__Vector_base<std::vector<long,_std::allocator<long>_>,_std::allocator<std::vector<long,_std::allocator<long>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_start;
      }
      else {
        ppVar16 = (pair<long,_int> *)((long)pvVar13 + 0x100);
        std::
        __insertion_sort<__gnu_cxx::__normal_iterator<std::pair<long,int>*,std::vector<std::pair<long,int>,std::allocator<std::pair<long,int>>>>,__gnu_cxx::__ops::_Iter_comp_iter<PairedReadsMapper::get_node_inmediate_neighbours(long)::__0>>
                  (pvVar13,ppVar16);
        ppVar3 = (pair<long,_int> *)
                 local_88.
                 super__Vector_base<std::vector<long,_std::allocator<long>_>,_std::allocator<std::vector<long,_std::allocator<long>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_start;
        if (ppVar16 != (pair<long,_int> *)pvVar4) {
          piVar10 = &((pair<long,_int> *)((long)pvVar13 + 0x100))->second;
          do {
            lVar12 = ppVar16->first;
            iVar1 = ppVar16->second;
            iVar11 = ppVar16[-1].second;
            ppVar9 = ppVar16;
            piVar5 = piVar10;
            if (iVar11 < iVar1) {
              do {
                piVar8 = piVar5;
                ((pair<long,_int> *)(piVar8 + -2))->first = *(long *)(piVar8 + -6);
                *piVar8 = iVar11;
                iVar11 = piVar8[-8];
                piVar5 = piVar8 + -4;
              } while (iVar11 < iVar1);
              ppVar9 = (pair<long,_int> *)(piVar8 + -6);
            }
            ppVar9->first = lVar12;
            ppVar9->second = iVar1;
            ppVar16 = ppVar16 + 1;
            piVar10 = piVar10 + 4;
          } while (ppVar16 != (pair<long,_int> *)pvVar4);
        }
      }
    }
  }
  for (; ppVar3 != (pair<long,_int> *)
                   local_88.
                   super__Vector_base<std::vector<long,_std::allocator<long>_>,_std::allocator<std::vector<long,_std::allocator<long>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_finish; ppVar3 = ppVar3 + 1) {
    lVar12 = ppVar3->first;
    if ((lVar12 != 0) && (10 < ppVar3->second)) goto LAB_001b4efe;
  }
  lVar12 = 0;
LAB_001b4efe:
  if ((pair<long,_int> *)
      local_88.
      super__Vector_base<std::vector<long,_std::allocator<long>_>,_std::allocator<std::vector<long,_std::allocator<long>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start != (pair<long,_int> *)0x0) {
    operator_delete(local_88.
                    super__Vector_base<std::vector<long,_std::allocator<long>_>,_std::allocator<std::vector<long,_std::allocator<long>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_start,
                    (long)local_88.
                          super__Vector_base<std::vector<long,_std::allocator<long>_>,_std::allocator<std::vector<long,_std::allocator<long>_>_>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_88.
                          super__Vector_base<std::vector<long,_std::allocator<long>_>,_std::allocator<std::vector<long,_std::allocator<long>_>_>_>
                          ._M_impl.super__Vector_impl_data._M_start);
  }
  std::
  _Hashtable<long,_std::pair<const_long,_int>,_std::allocator<std::pair<const_long,_int>_>,_std::__detail::_Select1st,_std::equal_to<long>,_std::hash<long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
  ::~_Hashtable(&local_60);
  return lVar12;
}

Assistant:

sgNodeID_t PairedReadsMapper::get_node_inmediate_neighbours(sgNodeID_t node){
    // 0 returning node is equivalent to None (in python)
    sgNodeID_t next_node=0;
    std::unordered_map<sgNodeID_t, int> counter;
    for(const auto &path: all_paths_fw(node)){
        for (const auto &node: path){
            counter[node]++;
        }
    }

    std::vector<std::pair<sgNodeID_t, int>> count_vector;
    for (const auto &x: counter){
        count_vector.push_back(x);
    }
    std::sort(count_vector.begin(), count_vector.end(), [](std::pair<sgNodeID_t, int>& a, std::pair<sgNodeID_t, int>& b){return a.second>b.second;});

    for (const auto& cand: count_vector){
        if (cand.first != 0 and cand.second>10){
            return cand.first;
        }
    }
    return next_node;
}